

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::HeapType::getReferencedHeapTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapType *this)

{
  iterator iVar1;
  HeapType local_28;
  optional<wasm::HeapType> super;
  
  getHeapTypeChildren(__return_storage_ptr__,this);
  local_28 = (HeapType)this->id;
  if (local_28.id < 0x7d) {
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = false;
  }
  else {
    local_28.id = *(ulong *)(local_28.id + 8);
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = local_28.id != 0;
  }
  if ((bool)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ != false) {
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__,
                 iVar1,&local_28);
    }
    else {
      (iVar1._M_current)->id = local_28.id;
      (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_28 = (HeapType)this->id;
  if (local_28.id < 0x7d) {
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = false;
  }
  else {
    local_28.id = *(ulong *)(local_28.id + 0x10);
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = local_28.id != 0;
  }
  if ((bool)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ != false) {
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__,
                 iVar1,&local_28);
    }
    else {
      (iVar1._M_current)->id = local_28.id;
      (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_28 = (HeapType)this->id;
  if (local_28.id < 0x7d) {
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = false;
  }
  else {
    local_28.id = *(ulong *)(local_28.id + 0x18);
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = local_28.id != 0;
  }
  if ((bool)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ != false) {
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__,
                 iVar1,&local_28);
    }
    else {
      (iVar1._M_current)->id = local_28.id;
      (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> HeapType::getReferencedHeapTypes() const {
  auto types = getHeapTypeChildren();
  if (auto super = getDeclaredSuperType()) {
    types.push_back(*super);
  }
  if (auto desc = getDescriptorType()) {
    types.push_back(*desc);
  }
  if (auto desc = getDescribedType()) {
    types.push_back(*desc);
  }
  return types;
}